

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::
on<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,
          assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
          assertion)

{
  undefined1 *this_00;
  size_t *psVar1;
  uint *puVar2;
  long lVar3;
  undefined8 in_RAX;
  size_t sVar4;
  printer *ppVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  undefined8 uStack_38;
  
  this_00 = &(this->printer_).field_0x40;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  ",3);
  pcVar9 = assertion.location.file_;
  sVar4 = strlen(assertion.location.file_);
  sVar6 = sVar4;
  if (sVar4 != 0) {
    do {
      if (sVar6 == 0) goto LAB_00122ddd;
      lVar3 = sVar6 - 1;
      sVar6 = sVar6 - 1;
    } while (pcVar9[lVar3] != '/');
    if (sVar4 == 0) {
LAB_00122dcf:
      uVar7 = 0;
    }
    else {
      uVar8 = sVar4 + 1;
      do {
        if (uVar8 == 1) goto LAB_00122dcf;
        uVar7 = uVar8 - 1;
        lVar3 = uVar8 - 2;
        uVar8 = uVar7;
      } while (pcVar9[lVar3] != '/');
    }
    bVar10 = sVar4 < uVar7;
    sVar4 = sVar4 - uVar7;
    if (bVar10) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    pcVar9 = pcVar9 + uVar7;
  }
LAB_00122ddd:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar9,sVar4);
  uStack_38._0_6_ = CONCAT15(0x3a,(undefined5)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(char *)((long)&uStack_38 + 5),1);
  std::ostream::operator<<((ostream *)this_00,assertion.location.line_);
  uStack_38._0_7_ = CONCAT16(0x3a,(undefined6)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(char *)((long)&uStack_38 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.fail._M_str,
             (this->printer_).colors_.fail._M_len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"FAILED",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," [",2);
  puVar2 = (uint *)(&(this->printer_).field_0x58 +
                   *(long *)(*(long *)&(this->printer_).field_0x40 + -0x18));
  *puVar2 = *puVar2 | 1;
  ppVar5 = printer::operator<<(&this->printer_,&assertion.expr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ppVar5->field_0x40,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  uStack_38 = CONCAT17(0x5d,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ppVar5->field_0x40,(char *)((long)&uStack_38 + 7),1);
  psVar1 = &(this->asserts_).fail;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }